

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O0

void __thiscall
websocketpp::connection<websocketpp::config::asio>::send_http_request
          (connection<websocketpp::config::asio> *this)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *this_00;
  ulong uVar5;
  _Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>
  *__f;
  function<void_(const_std::error_code_&)> *this_01;
  size_t in_RCX;
  size_t __n;
  long in_RDI;
  shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *__args;
  error_code ec;
  string *in_stack_fffffffffffffd78;
  parser *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  parser *in_stack_fffffffffffffd90;
  connection<websocketpp::config::asio> *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  allocator *in_stack_fffffffffffffdc8;
  undefined1 local_1d0 [104];
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe98;
  code *duration;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  undefined8 in_stack_fffffffffffffec8;
  element_type *in_stack_fffffffffffffed0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffed8;
  connection<websocketpp::config::asio::transport_config> *in_stack_fffffffffffffee0;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [24];
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  string local_68 [4];
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa0;
  undefined1 local_38 [32];
  error_code local_18;
  
  peVar3 = std::
           __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x31579b);
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (peVar3,0x400,"connection send_http_request",in_RCX);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x4c00));
  if (bVar1) {
    std::error_code::error_code((error_code *)in_stack_fffffffffffffd80);
    peVar4 = std::
             __shared_ptr_access<websocketpp::processor::processor<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::processor::processor<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3157ed);
    std::shared_ptr<websocketpp::uri>::shared_ptr
              ((shared_ptr<websocketpp::uri> *)in_stack_fffffffffffffd80,
               (shared_ptr<websocketpp::uri> *)in_stack_fffffffffffffd78);
    local_38._16_4_ = (*peVar4->_vptr_processor[8])(peVar4,in_RDI + 0x4ca0,local_38,in_RDI + 0x4e88)
    ;
    __n = (size_t)(uint)local_38._16_4_;
    local_18._4_4_ = local_38._20_4_;
    local_18._M_value = local_38._16_4_;
    std::shared_ptr<websocketpp::uri>::~shared_ptr((shared_ptr<websocketpp::uri> *)0x3158b6);
    bVar1 = std::error_code::operator_cast_to_bool(&local_18);
    if (bVar1) {
      log_err<std::error_code>
                ((connection<websocketpp::config::asio> *)in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff9c,(char *)in_stack_ffffffffffffff90,
                 (error_code *)in_stack_ffffffffffffff88);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"User-Agent",(allocator *)&stack0xffffffffffffff97);
      http::parser::parser::get_header
                ((parser *)in_stack_fffffffffffffd98,&in_stack_fffffffffffffd90->m_version);
      bVar2 = std::__cxx11::string::empty();
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
      if ((bVar2 & 1) != 0) {
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_90,"User-Agent",&local_91);
          http::parser::parser::replace_header
                    (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                     &in_stack_fffffffffffffd80->m_version);
          std::__cxx11::string::~string(local_90);
          std::allocator<char>::~allocator((allocator<char> *)&local_91);
        }
        else {
          in_stack_fffffffffffffdc0 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (in_RDI + 0x4ca0);
          in_stack_fffffffffffffdc8 = &local_b9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_b8,"User-Agent",in_stack_fffffffffffffdc8);
          http::parser::parser::remove_header(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
          std::__cxx11::string::~string(local_b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        }
      }
      http::parser::request::raw_abi_cxx11_((request *)in_stack_ffffffffffffff88);
      std::__cxx11::string::operator=((string *)(in_RDI + 0x4be0),local_e0);
      std::__cxx11::string::~string(local_e0);
      peVar3 = std::
               __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x315c1c);
      bVar1 = log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::static_test
                        (peVar3,0x400);
      if (bVar1) {
        peVar3 = std::
                 __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x315c46);
        std::operator+((char *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
        log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                  (peVar3,0x400,&stack0xffffffffffffff00,__n);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
      }
      if (0 < *(long *)(in_RDI + 0xb10)) {
        duration = handle_open_handshake_timeout;
        this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        get_shared(in_stack_fffffffffffffd98);
        std::
        bind<void(websocketpp::connection<websocketpp::config::asio>::*)(std::error_code_const&),std::shared_ptr<websocketpp::connection<websocketpp::config::asio>>,std::_Placeholder<1>const&>
                  ((offset_in_connection<websocketpp::config::asio>_to_subr *)
                   in_stack_fffffffffffffd88,
                   (shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)
                   in_stack_fffffffffffffd80,(_Placeholder<1> *)in_stack_fffffffffffffd78);
        std::function<void(std::error_code_const&)>::
        function<std::_Bind<void(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>>,std::_Placeholder<1>))(std::error_code_const&)>,void>
                  ((function<void_(const_std::error_code_&)> *)in_stack_fffffffffffffd90,
                   (_Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>
                    *)in_stack_fffffffffffffd88);
        transport::asio::connection<websocketpp::config::asio::transport_config>::set_timer
                  ((connection<websocketpp::config::asio::transport_config> *)this_02._M_pi,
                   (long)duration,(timer_handler *)in_stack_fffffffffffffe98._M_pi);
        std::
        shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
        ::operator=((shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                     *)in_stack_fffffffffffffd80,
                    (shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                     *)in_stack_fffffffffffffd78);
        std::
        shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
        ::~shared_ptr((shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                       *)0x315d9c);
        std::function<void_(const_std::error_code_&)>::~function
                  ((function<void_(const_std::error_code_&)> *)0x315da9);
        std::
        _Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>
        ::~_Bind((_Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>
                  *)0x315db6);
        std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>::~shared_ptr
                  ((shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)0x315dc3);
      }
      __args = (shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)(in_RDI + 0x4be0);
      __f = (_Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>
             *)std::__cxx11::string::data();
      this_01 = (function<void_(const_std::error_code_&)> *)std::__cxx11::string::size();
      local_1d0._16_8_ = handle_send_http_request;
      local_1d0._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      get_shared((connection<websocketpp::config::asio> *)local_1d0);
      std::
      bind<void(websocketpp::connection<websocketpp::config::asio>::*)(std::error_code_const&),std::shared_ptr<websocketpp::connection<websocketpp::config::asio>>,std::_Placeholder<1>const&>
                (&__f->_M_f,__args,(_Placeholder<1> *)in_stack_fffffffffffffd78);
      std::function<void(std::error_code_const&)>::
      function<std::_Bind<void(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>>,std::_Placeholder<1>))(std::error_code_const&)>,void>
                (this_01,__f);
      transport::asio::connection<websocketpp::config::asio::transport_config>::async_write
                (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8._M_pi,
                 (size_t)in_stack_fffffffffffffed0,(write_handler *)in_stack_fffffffffffffec8);
      std::function<void_(const_std::error_code_&)>::~function
                ((function<void_(const_std::error_code_&)> *)0x315efb);
      std::
      _Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>
      ::~_Bind((_Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>
                *)0x315f08);
      std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>::~shared_ptr
                ((shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)0x315f15);
    }
  }
  else {
    this_00 = std::
              __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x31592b);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
              (this_00,0x20,"Internal library error: missing processor",in_RCX);
  }
  return;
}

Assistant:

void connection<config>::send_http_request() {
    m_alog->write(log::alevel::devel,"connection send_http_request");

    // TODO: origin header?

    // Have the protocol processor fill in the appropriate fields based on the
    // selected client version
    if (m_processor) {
        lib::error_code ec;
        ec = m_processor->client_handshake_request(m_request,m_uri,
            m_requested_subprotocols);

        if (ec) {
            log_err(log::elevel::fatal,"Internal library error: Processor",ec);
            return;
        }
    } else {
        m_elog->write(log::elevel::fatal,"Internal library error: missing processor");
        return;
    }

    // Unless the user has overridden the user agent, send generic WS++ UA.
    if (m_request.get_header("User-Agent").empty()) {
        if (!m_user_agent.empty()) {
            m_request.replace_header("User-Agent",m_user_agent);
        } else {
            m_request.remove_header("User-Agent");
        }
    }

    m_handshake_buffer = m_request.raw();

    if (m_alog->static_test(log::alevel::devel)) {
        m_alog->write(log::alevel::devel,"Raw Handshake request:\n"+m_handshake_buffer);
    }

    if (m_open_handshake_timeout_dur > 0) {
        m_handshake_timer = transport_con_type::set_timer(
            m_open_handshake_timeout_dur,
            lib::bind(
                &type::handle_open_handshake_timeout,
                type::get_shared(),
                lib::placeholders::_1
            )
        );
    }

    transport_con_type::async_write(
        m_handshake_buffer.data(),
        m_handshake_buffer.size(),
        lib::bind(
            &type::handle_send_http_request,
            type::get_shared(),
            lib::placeholders::_1
        )
    );
}